

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O0

int wasm_eval(uint8_t *digitPtr)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *__s;
  mnist_model *this_00;
  allocator<char> *in_RDI;
  int32_t pred;
  ggml_opt_result_t result;
  mnist_model model;
  ggml_tensor *data;
  ggml_opt_dataset_t dataset;
  vector<float,_std::allocator<float>_> digit;
  allocator<char> *this_01;
  allocator_type *in_stack_fffffffffffffe48;
  void *__dest;
  uchar *in_stack_fffffffffffffe50;
  uchar *in_stack_fffffffffffffe58;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe60;
  int local_174;
  ggml_opt_result_t local_170;
  allocator<char> local_161;
  string local_160 [16];
  mnist_model *in_stack_fffffffffffffeb0;
  allocator<char> local_139;
  string local_138 [64];
  ggml_opt_dataset_t in_stack_ffffffffffffff08;
  mnist_model *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  
  std::allocator<float>::allocator((allocator<float> *)0x10c409);
  std::vector<float,std::allocator<float>>::vector<unsigned_char*,void>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48);
  std::allocator<float>::~allocator((allocator<float> *)0x10c434);
  uVar1 = ggml_opt_dataset_init(0x310,10,1);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ggml_opt_dataset_data(uVar1);
  __dest = *(void **)((long)&this[7].field_2 + 8);
  __s = (char *)ggml_nbytes();
  memcpy(__dest,in_RDI,(size_t)__s);
  this_00 = (mnist_model *)ggml_opt_dataset_labels(uVar1);
  ggml_set_zero(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,in_RDI);
  this_01 = &local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,in_RDI);
  mnist_model_init_from_file
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  mnist_model_build(in_stack_fffffffffffffeb0);
  local_170 = mnist_model_eval(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ggml_opt_result_pred(local_170,&local_174);
  mnist_model::~mnist_model(this_00);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)this_01);
  return local_174;
}

Assistant:

int wasm_eval(uint8_t * digitPtr) {
    std::vector<float> digit(digitPtr, digitPtr + MNIST_NINPUT);

    ggml_opt_dataset_t dataset = ggml_opt_dataset_init(MNIST_NINPUT, MNIST_NCLASSES, 1, 1);
    struct ggml_tensor * data = ggml_opt_dataset_data(dataset);
    memcpy(data->data, digitPtr, ggml_nbytes(data));
    ggml_set_zero(ggml_opt_dataset_labels(dataset)); // The labels are not needed.

    mnist_model model = mnist_model_init_from_file("mnist-f32.gguf", "CPU", /*nbatch_logical =*/ 1, /*nbatch_physical =*/ 1);
    mnist_model_build(model);
    ggml_opt_result_t result = mnist_model_eval(model, dataset);

    int32_t pred;
    ggml_opt_result_pred(result, &pred);

    return pred;
}